

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_two_connections.cpp
# Opt level: O2

void __thiscall
TwoConnections_CommitToFirstConnectionDoesNotAffectFooterPosForSecond_Test::
~TwoConnections_CommitToFirstConnectionDoesNotAffectFooterPosForSecond_Test
          (TwoConnections_CommitToFirstConnectionDoesNotAffectFooterPosForSecond_Test *this)

{
  anon_unknown.dwarf_36f446::TwoConnections::~TwoConnections(&this->super_TwoConnections);
  operator_delete(this,0x270);
  return;
}

Assistant:

TEST_F (TwoConnections, CommitToFirstConnectionDoesNotAffectFooterPosForSecond) {
    ASSERT_EQ (pstore::leader_size, second.footer_pos ().absolute ());
    {
        auto transaction = pstore::begin (first);
        append_int (transaction, 1);
        transaction.commit ();
    }
    EXPECT_GE (first.footer_pos ().absolute (),
               pstore::leader_size + sizeof (int) + sizeof (pstore::trailer));
    EXPECT_EQ (second.footer_pos ().absolute (), pstore::leader_size);
}